

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFWriter.cpp
# Opt level: O1

EStatusCode __thiscall PDFWriter::SetupState(PDFWriter *this,string *inStateFilePath)

{
  bool bVar1;
  EStatusCode EVar2;
  Trace *this_00;
  PDFParser *pPVar3;
  ObjectIDType inObjectId;
  PDFObject *pPVar4;
  PDFDictionary *pPVar5;
  longlong lVar6;
  PDFObjectCastPtr<PDFIndirectObjectReference> objectsContextObject;
  PDFObjectCastPtr<PDFDictionary> pdfWriterDictionary;
  PDFObjectCastPtr<PDFIndirectObjectReference> documentContextObject;
  PDFObjectCastPtr<PDFBoolean> isModifiedObject;
  StateReader reader;
  RefCountPtr<PDFIndirectObjectReference> local_770;
  RefCountPtr<PDFDictionary> local_760;
  RefCountPtr<PDFIndirectObjectReference> local_750;
  RefCountPtr<PDFBoolean> local_740;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  StateReader local_6b0;
  
  StateReader::StateReader(&local_6b0);
  EVar2 = StateReader::Start(&local_6b0,inStateFilePath);
  if (EVar2 == eSuccess) {
    pPVar3 = StateReader::GetObjectsReader(&local_6b0);
    inObjectId = StateReader::GetRootObjectID(&local_6b0);
    pPVar4 = PDFParser::ParseNewObject(pPVar3,inObjectId);
    pPVar5 = PDFObjectCast<PDFDictionary>(pPVar4);
    local_760._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a97b0;
    local_760.mValue = pPVar5;
    local_6d0._M_dataplus._M_p = (pointer)&local_6d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d0,"mIsModified","");
    pPVar4 = PDFDictionary::QueryDirectObject(pPVar5,&local_6d0);
    local_740.mValue = PDFObjectCast<PDFBoolean>(pPVar4);
    local_740._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003ab068;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6d0._M_dataplus._M_p != &local_6d0.field_2) {
      operator_delete(local_6d0._M_dataplus._M_p,local_6d0.field_2._M_allocated_capacity + 1);
    }
    bVar1 = PDFBoolean::GetValue(local_740.mValue);
    pPVar5 = local_760.mValue;
    this->mIsModified = bVar1;
    if (bVar1) {
      local_6f0._M_dataplus._M_p = (pointer)&local_6f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6f0,"mModifiedFileVersion","");
      pPVar4 = PDFDictionary::QueryDirectObject(pPVar5,&local_6f0);
      local_770.mValue = (PDFIndirectObjectReference *)PDFObjectCast<PDFInteger>(pPVar4);
      local_770._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003ab0a0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f0._M_dataplus._M_p != &local_6f0.field_2) {
        operator_delete(local_6f0._M_dataplus._M_p,local_6f0.field_2._M_allocated_capacity + 1);
      }
      lVar6 = PDFInteger::GetValue((PDFInteger *)local_770.mValue);
      this->mModifiedFileVersion = (EPDFVersion)lVar6;
      RefCountPtr<PDFInteger>::~RefCountPtr((RefCountPtr<PDFInteger> *)&local_770);
    }
    pPVar5 = local_760.mValue;
    local_710._M_dataplus._M_p = (pointer)&local_710.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_710,"mObjectsContext","");
    pPVar4 = PDFDictionary::QueryDirectObject(pPVar5,&local_710);
    local_770.mValue = PDFObjectCast<PDFIndirectObjectReference>(pPVar4);
    local_770._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a9a10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_710._M_dataplus._M_p != &local_710.field_2) {
      operator_delete(local_710._M_dataplus._M_p,local_710.field_2._M_allocated_capacity + 1);
    }
    pPVar3 = StateReader::GetObjectsReader(&local_6b0);
    EVar2 = ObjectsContext::ReadState(&this->mObjectsContext,pPVar3,(local_770.mValue)->mObjectID);
    pPVar5 = local_760.mValue;
    if (EVar2 == eSuccess) {
      local_730._M_dataplus._M_p = (pointer)&local_730.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_730,"mDocumentContext","");
      pPVar4 = PDFDictionary::QueryDirectObject(pPVar5,&local_730);
      local_750.mValue = PDFObjectCast<PDFIndirectObjectReference>(pPVar4);
      local_750._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a9a10;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_730._M_dataplus._M_p != &local_730.field_2) {
        operator_delete(local_730._M_dataplus._M_p,local_730.field_2._M_allocated_capacity + 1);
      }
      pPVar3 = StateReader::GetObjectsReader(&local_6b0);
      EVar2 = PDFHummus::DocumentContext::ReadState
                        (&this->mDocumentContext,pPVar3,(local_750.mValue)->mObjectID);
      if (EVar2 == eSuccess) {
        StateReader::Finish(&local_6b0);
      }
      RefCountPtr<PDFIndirectObjectReference>::~RefCountPtr(&local_750);
    }
    RefCountPtr<PDFIndirectObjectReference>::~RefCountPtr(&local_770);
    RefCountPtr<PDFBoolean>::~RefCountPtr(&local_740);
    RefCountPtr<PDFDictionary>::~RefCountPtr(&local_760);
  }
  else {
    this_00 = Trace::DefaultTrace();
    Trace::TraceToLog(this_00,"PDFWriter::SetupState, cant start state readering");
  }
  StateReader::~StateReader(&local_6b0);
  return EVar2;
}

Assistant:

EStatusCode PDFWriter::SetupState(const std::string& inStateFilePath)
{
	EStatusCode status;

	do
	{
		StateReader reader;

		status = reader.Start(inStateFilePath);
		if(status != eSuccess)
		{
			TRACE_LOG("PDFWriter::SetupState, cant start state readering");
			break;
		}

		PDFObjectCastPtr<PDFDictionary> pdfWriterDictionary(reader.GetObjectsReader()->ParseNewObject(reader.GetRootObjectID()));

        PDFObjectCastPtr<PDFBoolean> isModifiedObject(pdfWriterDictionary->QueryDirectObject("mIsModified"));
        mIsModified = isModifiedObject->GetValue();

        if(mIsModified)
        {
            PDFObjectCastPtr<PDFInteger> isModifiedFileVersionObject(pdfWriterDictionary->QueryDirectObject("mModifiedFileVersion"));
            mModifiedFileVersion = (EPDFVersion)(isModifiedFileVersionObject->GetValue());
        }

		PDFObjectCastPtr<PDFIndirectObjectReference> objectsContextObject(pdfWriterDictionary->QueryDirectObject("mObjectsContext"));
		status = mObjectsContext.ReadState(reader.GetObjectsReader(),objectsContextObject->mObjectID);
		if(status!= eSuccess)
			break;

		PDFObjectCastPtr<PDFIndirectObjectReference> documentContextObject(pdfWriterDictionary->QueryDirectObject("mDocumentContext"));
		status = mDocumentContext.ReadState(reader.GetObjectsReader(),documentContextObject->mObjectID);
		if(status!= eSuccess)
			break;

		reader.Finish();

	}while(false);

	return status;
}